

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void storeRGBA32FFromRGBA32F_sse4
               (uchar *dest,QRgbaFloat32 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QRgbaFloat32 *pQVar3;
  undefined1 auVar4 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_188;
  undefined8 uStack_180;
  int local_16c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  __m128 vsr;
  float a;
  __m128 vsa;
  __m128 vsf;
  float fStack_40;
  float fStack_3c;
  int i;
  __m128 zero;
  QRgbaFloat32 *d;
  QDitherInfo *param_5_local;
  QList<unsigned_int> *param_4_local;
  
  for (local_16c = 0; local_16c < count; local_16c = local_16c + 1) {
    pQVar3 = src + local_16c;
    uVar1._0_4_ = pQVar3->r;
    uVar1._4_4_ = pQVar3->g;
    uVar2._0_4_ = pQVar3->b;
    uVar2._4_4_ = pQVar3->a;
    if ((((float)uVar2._4_4_ != 1.0) ||
        (local_188 = uVar1, uStack_180 = uVar2, NAN((float)uVar2._4_4_))) &&
       (((float)uVar2._4_4_ != 0.0 || (local_188 = 0, uStack_180 = 0, NAN((float)uVar2._4_4_))))) {
      auVar4._4_4_ = uVar2._4_4_;
      auVar4._0_4_ = uVar2._4_4_;
      auVar4._8_4_ = uVar2._4_4_;
      auVar4._12_4_ = uVar2._4_4_;
      auVar4 = rcpps(auVar4,auVar4);
      vsf[2] = auVar4._0_4_;
      vsf[3] = auVar4._4_4_;
      fStack_40 = auVar4._8_4_;
      fStack_3c = auVar4._12_4_;
      local_1b8._4_4_ = (vsf[3] + vsf[3]) - vsf[3] * vsf[3] * (float)uVar2._4_4_;
      local_1b8._0_4_ = (vsf[2] + vsf[2]) - vsf[2] * vsf[2] * (float)uVar2._4_4_;
      fStack_1b0 = (fStack_40 + fStack_40) - fStack_40 * fStack_40 * (float)uVar2._4_4_;
      fStack_1ac = (fStack_3c + fStack_3c) - fStack_3c * fStack_3c * (float)uVar2._4_4_;
      auVar4 = insertps(_local_1b8,ZEXT416(0x3f800000),0x30);
      local_118 = auVar4._0_4_;
      fStack_114 = auVar4._4_4_;
      fStack_110 = auVar4._8_4_;
      fStack_10c = auVar4._12_4_;
      local_188 = CONCAT44((float)uVar1._4_4_ * fStack_114,(float)(undefined4)uVar1 * local_118);
      uStack_180 = CONCAT44((float)uVar2._4_4_ * fStack_10c,(float)(undefined4)uVar2 * fStack_110);
    }
    *(undefined8 *)(dest + (long)local_16c * 0x10 + (long)index * 0x10) = local_188;
    *(undefined8 *)(dest + (long)local_16c * 0x10 + (long)index * 0x10 + 8) = uStack_180;
  }
  return;
}

Assistant:

void QT_FASTCALL storeRGBA32FFromRGBA32F_sse4(uchar *dest, const QRgbaFloat32 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    QRgbaFloat32 *d = reinterpret_cast<QRgbaFloat32 *>(dest) + index;
    const __m128 zero = _mm_set1_ps(0.0f);
    for (int i = 0; i < count; ++i) {
        __m128 vsf = _mm_load_ps(reinterpret_cast<const float *>(src + i));
        const __m128 vsa = _mm_shuffle_ps(vsf, vsf, _MM_SHUFFLE(3, 3, 3, 3));
        const float a = _mm_cvtss_f32(vsa);
        if (a == 1.0f)
        { }
        else if (a == 0.0f)
            vsf = zero;
        else {
            __m128 vsr = _mm_rcp_ps(vsa);
            vsr = _mm_sub_ps(_mm_add_ps(vsr, vsr), _mm_mul_ps(vsr, _mm_mul_ps(vsr, vsa)));
            vsr = _mm_insert_ps(vsr, _mm_set_ss(1.0f), 0x30);
            vsf = _mm_mul_ps(vsf, vsr);
        }
        _mm_store_ps(reinterpret_cast<float *>(d + i), vsf);
    }
}